

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::ExecuteCommand
          (cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  bool bVar1;
  WorkingMode WVar2;
  long *plVar3;
  ostream *poVar4;
  cmState *this_00;
  string *psVar5;
  cmake *pcVar6;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *__args;
  cmAlphaNum local_4e8;
  cmAlphaNum local_4b8;
  undefined1 local_488 [8];
  string error_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_448;
  undefined1 local_428 [8];
  string error;
  undefined1 local_400 [6];
  bool hadNestedError;
  bool invokeSucceeded;
  Command command;
  string local_3d8;
  undefined1 local_3b8 [8];
  ostringstream e;
  int local_23c;
  istringstream local_238 [4];
  int d;
  istringstream s;
  allocator<char> local_b1;
  string local_b0;
  cmValue local_90;
  cmValue depthStr;
  int depth;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  undefined1 local_50 [8];
  cmMakefileCall stack_manager;
  bool result;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *deferId_local;
  cmExecutionStatus *status_local;
  cmListFileFunction *lff_local;
  cmMakefile *this_local;
  
  stack_manager.ProfilingDataRAII.super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>.
  _M_payload.super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
  super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ = 1;
  bVar1 = IsFunctionBlocked(this,lff,status);
  if (bVar1) {
    this_local._7_1_ =
         (bool)(stack_manager.ProfilingDataRAII.
                super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
                super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
                super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ & 1);
  }
  else {
    bVar1 = std::function::operator_cast_to_bool((function *)&this->ExecuteCommandCallback);
    if (bVar1) {
      std::function<void_()>::operator()(&this->ExecuteCommandCallback);
    }
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional(&local_78,deferId);
    cmMakefileCall::cmMakefileCall((cmMakefileCall *)local_50,this,lff,&local_78,status);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_78);
    depthStr.Value._0_4_ = 1000;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"CMAKE_MAXIMUM_RECURSION_DEPTH",&local_b1);
    local_90 = GetDefinition(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    bVar1 = cmValue::operator_cast_to_bool(&local_90);
    if (bVar1) {
      psVar5 = cmValue::operator*[abi_cxx11_(&local_90);
      std::__cxx11::istringstream::istringstream(local_238,(string *)psVar5,_S_in);
      plVar3 = (long *)std::istream::operator>>(local_238,&local_23c);
      bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      if (bVar1) {
        depthStr.Value._0_4_ = local_23c;
      }
      std::__cxx11::istringstream::~istringstream(local_238);
    }
    if ((int)depthStr.Value < this->RecursionDepth) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
      poVar4 = std::operator<<((ostream *)local_3b8,"Maximum recursion depth of ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)depthStr.Value);
      std::operator<<(poVar4," exceeded");
      std::__cxx11::ostringstream::str();
      IssueMessage(this,FATAL_ERROR,&local_3d8);
      std::__cxx11::string::~string((string *)&local_3d8);
      cmSystemTools::SetFatalErrorOccurred();
      this_local._7_1_ = false;
      command._M_invoker._4_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
    }
    else {
      this_00 = GetState(this);
      psVar5 = cmListFileFunction::LowerCaseName_abi_cxx11_(lff);
      cmState::GetCommandByExactName((Command *)local_400,this_00,psVar5);
      bVar1 = std::function::operator_cast_to_bool((function *)local_400);
      if (bVar1) {
        bVar1 = cmSystemTools::GetFatalErrorOccurred();
        if (!bVar1) {
          pcVar6 = GetCMakeInstance(this);
          bVar1 = cmake::GetTrace(pcVar6);
          if (bVar1) {
            PrintCommandTrace(this,lff,&this->Backtrace,No);
          }
          __args = cmListFileFunction::Arguments(lff);
          error.field_2._M_local_buf[0xf] =
               std::
               function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
               ::operator()((function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                             *)local_400,__args,status);
          error.field_2._M_local_buf[0xe] = cmExecutionStatus::GetNestedError(status);
          if (((error.field_2._M_local_buf[0xf] & 1U) == 0) ||
             ((bool)error.field_2._M_local_buf[0xe])) {
            if (!(bool)error.field_2._M_local_buf[0xe]) {
              psVar5 = cmListFileFunction::OriginalName_abi_cxx11_(lff);
              std::__cxx11::string::string
                        ((string *)(error_1.field_2._M_local_buf + 8),(string *)psVar5);
              std::operator+(&local_448,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&error_1.field_2 + 8)," ");
              psVar5 = cmExecutionStatus::GetError_abi_cxx11_(status);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_428,&local_448,psVar5);
              std::__cxx11::string::~string((string *)&local_448);
              std::__cxx11::string::~string((string *)(error_1.field_2._M_local_buf + 8));
              IssueMessage(this,FATAL_ERROR,(string *)local_428);
              std::__cxx11::string::~string((string *)local_428);
            }
            stack_manager.ProfilingDataRAII.
            super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
            super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
            super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ = 0;
            pcVar6 = GetCMakeInstance(this);
            WVar2 = cmake::GetWorkingMode(pcVar6);
            if (WVar2 != NORMAL_MODE) {
              cmSystemTools::SetFatalErrorOccurred();
            }
          }
        }
      }
      else {
        bVar1 = cmSystemTools::GetFatalErrorOccurred();
        if (!bVar1) {
          cmAlphaNum::cmAlphaNum(&local_4b8,"Unknown CMake command \"");
          psVar5 = cmListFileFunction::OriginalName_abi_cxx11_(lff);
          cmAlphaNum::cmAlphaNum(&local_4e8,psVar5);
          cmStrCat<char[3]>((string *)local_488,&local_4b8,&local_4e8,(char (*) [3])0xd299d5);
          IssueMessage(this,FATAL_ERROR,(string *)local_488);
          stack_manager.ProfilingDataRAII.
          super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
          super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
          super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ = 0;
          cmSystemTools::SetFatalErrorOccurred();
          std::__cxx11::string::~string((string *)local_488);
        }
      }
      std::
      function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
      ::~function((function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                   *)local_400);
      this_local._7_1_ =
           (bool)(stack_manager.ProfilingDataRAII.
                  super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
                  super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
                  super__Optional_payload_base<cmMakefileProfilingData::RAII>._15_1_ & 1);
      command._M_invoker._4_4_ = 1;
    }
    cmMakefileCall::~cmMakefileCall((cmMakefileCall *)local_50);
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status,
                                cm::optional<std::string> deferId)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  if (this->ExecuteCommandCallback) {
    this->ExecuteCommandCallback();
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, std::move(deferId), status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  int depth = CMake_DEFAULT_RECURSION_LIMIT;
  cmValue depthStr = this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (depthStr) {
    std::istringstream s(*depthStr);
    int d;
    if (s >> d) {
      depth = d;
    }
  }
  if (this->RecursionDepth > depth) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depth << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // Lookup the command prototype.
  if (cmState::Command command =
        this->GetState()->GetCommandByExactName(lff.LowerCaseName())) {
    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff, this->Backtrace);
      }
      // Try invoking the command.
      bool invokeSucceeded = command(lff.Arguments(), status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            std::string(lff.OriginalName()) + " " + status.GetError();
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccurred();
        }
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      std::string error =
        cmStrCat("Unknown CMake command \"", lff.OriginalName(), "\".");
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return result;
}